

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

bool __thiscall FIX::Message::isApp(Message *this)

{
  bool bVar1;
  undefined1 local_70 [8];
  MsgType msgType;
  Message *this_local;
  
  msgType.super_StringField.super_FieldBase.m_metrics = (field_metrics)this;
  MsgType::MsgType((MsgType *)local_70);
  bVar1 = FieldMap::getFieldIfSet(&(this->m_header).super_FieldMap,(FieldBase *)local_70);
  if (bVar1) {
    bVar1 = isAdminMsgType((MsgType *)local_70);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  MsgType::~MsgType((MsgType *)local_70);
  return this_local._7_1_;
}

Assistant:

bool isApp() const {
    MsgType msgType;
    if (m_header.getFieldIfSet(msgType)) {
      return !isAdminMsgType(msgType);
    }
    return false;
  }